

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O0

void __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>::
~QStringBuilder(QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
                *this)

{
  ProString::~ProString((ProString *)0x225cf0);
  QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>::~QStringBuilder
            ((QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]> *)0x225cfa);
  return;
}

Assistant:

~QStringBuilder() = default;